

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsay.c
# Opt level: O3

int get_option(int argc,char **argv)

{
  byte bVar1;
  _Bool _Var2;
  size_t sVar3;
  long *plVar4;
  long *plVar5;
  char *pcVar6;
  byte *__s;
  size_t unaff_R13;
  long lVar7;
  long *plVar8;
  long *plVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  long *plVar13;
  char acStack_170 [264];
  char **ppcStack_68;
  byte *pbStack_60;
  size_t sStack_58;
  char *pcStack_50;
  ulong uStack_48;
  code *pcStack_40;
  
  message[0] = '\0';
  if (1 < argc) {
    uVar12 = 1;
    do {
      iVar10 = (int)uVar12;
      __s = (byte *)argv[iVar10];
      if ((*__s | 2) == 0x2f) {
        bVar1 = __s[1];
        if (bVar1 < 0x6f) {
          if (bVar1 != 0x66) {
            if (bVar1 == 0x68) {
              pcStack_40 = (code *)0x10157d;
              usage_exit();
              goto LAB_0010157d;
            }
            goto LAB_00101589;
          }
          pcStack_40 = (code *)0x1014d4;
          sVar3 = strlen((char *)__s);
          if (2 < sVar3) {
            __s = __s + 2;
            goto LAB_001014de;
          }
          uVar11 = iVar10 + 1;
          uVar12 = (ulong)uVar11;
          if (argc <= (int)uVar11) goto LAB_001015a6;
          __s = (byte *)argv[(int)uVar11];
          pcVar6 = infile;
        }
        else if (bVar1 == 0x6f) {
          pcStack_40 = (code *)0x1014ef;
          sVar3 = strlen((char *)__s);
          if (sVar3 < 3) {
            uVar11 = iVar10 + 1;
            uVar12 = (ulong)uVar11;
            if (argc <= (int)uVar11) goto LAB_0010159a;
            __s = (byte *)argv[(int)uVar11];
            pcVar6 = outfile;
          }
          else {
            __s = __s + 2;
            pcVar6 = outfile;
          }
        }
        else {
          if (bVar1 != 0x76) goto LAB_00101589;
          pcStack_40 = (code *)0x10144c;
          sVar3 = strlen((char *)__s);
          if (sVar3 < 3) {
            uVar11 = iVar10 + 1;
            uVar12 = (ulong)uVar11;
            if (argc <= (int)uVar11) goto LAB_0010158e;
            __s = (byte *)argv[(int)uVar11];
            pcVar6 = voice;
          }
          else {
            __s = __s + 2;
            pcVar6 = voice;
          }
        }
LAB_00101503:
        pcStack_40 = (code *)0x101508;
        strcpy(pcVar6,(char *)__s);
      }
      else {
        pcStack_40 = (code *)0x10146e;
        unaff_R13 = strlen(message);
        pcStack_40 = (code *)0x101479;
        sVar3 = strlen((char *)__s);
        if (((sVar3 + unaff_R13) - (ulong)(unaff_R13 == 0)) - 0x103 < 0xfffffffffffffefb) {
LAB_0010157d:
          pcStack_40 = (code *)0x101589;
          error_exit("too long string.");
LAB_00101589:
          pcStack_40 = (code *)0x10158e;
          get_option_cold_1();
LAB_0010158e:
          pcStack_40 = (code *)0x10159a;
          error_exit("option requires an argument -- v");
LAB_0010159a:
          pcStack_40 = (code *)0x1015a6;
          error_exit("option requires an argument -- o");
LAB_001015a6:
          pcStack_40 = print_voice_list;
          error_exit("option requires an argument -- f");
          pcStack_50 = message;
          ppcStack_68 = argv;
          pbStack_60 = __s;
          sStack_58 = unaff_R13;
          uStack_48 = uVar12;
          pcStack_40 = (code *)(ulong)(uint)argc;
          plVar4 = (long *)openjtalk_getHTSVoiceList();
          plVar5 = plVar4;
          if (plVar4 != (long *)0x0) {
            plVar8 = (long *)0x0;
            plVar13 = plVar4;
            do {
              plVar5 = (long *)strlen((char *)plVar13[2]);
              plVar9 = plVar5;
              if (plVar5 < plVar8) {
                plVar9 = plVar8;
              }
              plVar13 = (long *)*plVar13;
              plVar8 = plVar9;
            } while (plVar13 != (long *)0x0);
            if (plVar4 != (long *)0x0) {
              do {
                pcVar6 = (char *)plVar4[2];
                sVar3 = strlen(pcVar6);
                acStack_170[0] = ' ';
                acStack_170[1] = '\0';
                if (~sVar3 + ((ulong)plVar9 & 0xfffffffffffffffc) + 4 != 0) {
                  lVar7 = sVar3 + (-3 - ((ulong)plVar9 & 0xfffffffffffffffc));
                  do {
                    sVar3 = strlen(acStack_170);
                    (acStack_170 + sVar3)[0] = ' ';
                    (acStack_170 + sVar3)[1] = '\0';
                    lVar7 = lVar7 + 1;
                  } while (lVar7 != 0);
                  pcVar6 = (char *)plVar4[2];
                }
                uVar11 = printf("%s%s%s\n",pcVar6,acStack_170,plVar4[1]);
                plVar5 = (long *)(ulong)uVar11;
                plVar4 = (long *)*plVar4;
              } while (plVar4 != (long *)0x0);
            }
          }
          return (int)plVar5;
        }
        pcStack_40 = (code *)0x10149e;
        _Var2 = check_fullpath((char *)__s);
        if (_Var2) {
LAB_001014de:
          pcVar6 = infile;
          goto LAB_00101503;
        }
        if (unaff_R13 != 0) {
          pcStack_40 = (code *)0x1014af;
          sVar3 = strlen(message);
          (message + sVar3)[0] = ' ';
          (message + sVar3)[1] = '\0';
        }
        pcStack_40 = (code *)0x1014c1;
        strcat(message,(char *)__s);
      }
      uVar11 = (int)uVar12 + 1;
      uVar12 = (ulong)uVar11;
    } while ((int)uVar11 < argc);
  }
  return 0;
}

Assistant:

int get_option(int argc, char *argv[])
{
	message[0] = '\0';
	for (int i = 1; i < argc; i++)
	{
		char *str = argv[i];
		if (str[0] == '-' || str[0] == '/')
		{
			switch (str[1])
			{
			case 'v':
				if (strlen(argv[i]) > 2)
				{
					strcpy(voice, &argv[i][2]);
				}
				else
				{
					if (i + 1 >= argc)
					{
						error_exit("option requires an argument -- v");
					}
					strcpy(voice, argv[++i]);
				}
				break;

			case 'o':
				if (strlen(argv[i]) > 2)
				{
					strcpy(outfile, &argv[i][2]);
				}
				else
				{
					if (i + 1 >= argc)
					{
						error_exit("option requires an argument -- o");
					}
					strcpy(outfile, argv[++i]);
				}
				break;

			case 'f':
				if (strlen(argv[i]) > 2)
				{
					strcpy(infile, &argv[i][2]);
				}
				else
				{
					if (i + 1 >= argc)
					{
						error_exit("option requires an argument -- f");
					}
					strcpy(infile, argv[++i]);
				}
				break;

			case 'h':
				usage_exit();
				break;

			default:
				fprintf(stderr, "invalid option -- %c\n", str[1]);
				usage_exit();
				break;
			}
		}
		else
		{
			size_t len = strlen(message);
			if (len + (len>0 ? 1 : 0) + strlen(str) + 1> MAX_PATH)
			{
				error_exit("too long string.");
			}
			if (check_fullpath(str))
			{
				strcpy(infile, str);
			}
			else
			{
				if (len > 0)
				{
					strcat(message, " ");
				}
				strcat(message, str);
			}
		}
	}
	return 0;
}